

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O1

char * skynet_socket_udp_address(skynet_socket_message *msg,int *addrsz)

{
  socket_udp_address *psVar1;
  socket_message sm;
  socket_message local_20;
  
  if (msg->type == 6) {
    local_20.id = msg->id;
    local_20.opaque = 0;
    local_20.ud = msg->ud;
    local_20.data = msg->buffer;
    psVar1 = socket_server_udp_address(SOCKET_SERVER,&local_20,addrsz);
    return (char *)psVar1;
  }
  return (char *)0x0;
}

Assistant:

const char *
skynet_socket_udp_address(struct skynet_socket_message *msg, int *addrsz) {
	if (msg->type != SKYNET_SOCKET_TYPE_UDP) {
		return NULL;
	}
	struct socket_message sm;
	sm.id = msg->id;
	sm.opaque = 0;
	sm.ud = msg->ud;
	sm.data = msg->buffer;
	return (const char *)socket_server_udp_address(SOCKET_SERVER, &sm, addrsz);
}